

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O1

uint ON_GetVersionString(uint major_version,uint minor_version,uint year,uint month,
                        uint day_of_month,uint hour,uint minute,uint branch,
                        size_t string_buffer_capacity,char *string_buffer)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  unsigned_short quartet_values [4];
  char s [24];
  
  s[0] = '\0';
  s[1] = '\0';
  s[2] = '\0';
  s[3] = '\0';
  s[4] = '\0';
  s[5] = '\0';
  s[6] = '\0';
  s[7] = '\0';
  s[8] = '\0';
  s[9] = '\0';
  s[10] = '\0';
  s[0xb] = '\0';
  s[0xc] = '\0';
  s[0xd] = '\0';
  s[0xe] = '\0';
  s[0xf] = '\0';
  s[0x10] = '\0';
  s[0x11] = '\0';
  s[0x12] = '\0';
  s[0x13] = '\0';
  s[0x14] = '\0';
  s[0x15] = '\0';
  s[0x16] = '\0';
  s[0x17] = '\0';
  quartet_values[0] = 0;
  quartet_values[1] = 0;
  quartet_values[2] = 0;
  quartet_values[3] = 0;
  uVar4 = ON_GetVersionQuartet
                    (major_version,minor_version,year,month,day_of_month,hour,minute,branch,
                     quartet_values);
  pcVar11 = string_buffer;
  if (string_buffer == (char *)0x0 || string_buffer_capacity == 0) {
    pcVar11 = s;
  }
  uVar6 = 0x18;
  if (string_buffer != (char *)0x0 && string_buffer_capacity != 0) {
    uVar6 = string_buffer_capacity;
  }
  uVar7 = 0;
  if (uVar4 != 0) {
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar12 = uVar7;
      if (uVar5 != 0) {
        uVar12 = (ulong)((int)uVar7 + 1);
        pcVar11[uVar7] = '.';
      }
      uVar7 = 0;
      uVar4 = 0;
      if (uVar6 != uVar12) {
        uVar1 = quartet_values[uVar5];
        uVar3 = 0;
        uVar4 = (uint)uVar1;
        do {
          uVar10 = uVar3;
          uVar9 = (int)uVar10 + 1;
          bVar2 = 9 < uVar4;
          uVar3 = (ulong)uVar9;
          uVar4 = uVar4 / 10;
        } while (bVar2);
        uVar4 = 0;
        if ((ulong)uVar9 < uVar6 - uVar12) {
          pcVar11[uVar9 + uVar12] = '\0';
          uVar8 = (uint)uVar1;
          do {
            pcVar11[uVar10 + uVar12] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
            uVar10 = (ulong)((int)uVar10 - 1);
            bVar2 = 9 < uVar8;
            uVar8 = uVar8 / 10;
            uVar4 = uVar9;
          } while (bVar2);
        }
      }
    } while (((uVar4 != 0) && (uVar7 = (ulong)(uVar4 + (int)uVar12), uVar5 < 3)) &&
            (uVar5 = uVar5 + 1, uVar7 < uVar6));
  }
  uVar5 = 0;
  if (uVar7 <= uVar6) {
    uVar5 = uVar7;
  }
  uVar4 = (uint)uVar5;
  uVar9 = uVar4;
  while (uVar5 < uVar6) {
    uVar9 = uVar9 + 1;
    pcVar11[uVar5] = '\0';
    uVar5 = (ulong)uVar9;
  }
  return uVar4;
}

Assistant:

unsigned int ON_GetVersionString(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int hour,
  unsigned int minute,
  unsigned int branch,
  size_t string_buffer_capacity,
  char* string_buffer
  )
{
  char s[24] = {0};
  const size_t s_capacity = sizeof(s)/sizeof(s[0]);
  unsigned int string_length = 0;
  unsigned int i, j;
  unsigned short quartet_values[4] = {0};
  unsigned int version_number = ON_GetVersionQuartet(
                                      major_version,
                                      minor_version,
                                      year,
                                      month,
                                      day_of_month,
                                      hour,
                                      minute,
                                      branch,
                                      quartet_values
                                      );

  if (string_buffer_capacity <= 0 || nullptr == string_buffer)
  {
    string_buffer_capacity = s_capacity;
    string_buffer = s;
  }

  if ( version_number > 0 )
  {
    for(i = 0; i < 4 && string_length < string_buffer_capacity; i++ )
    {
      if ( i > 0 )
        string_buffer[string_length++] = '.';

      j = AppendValueToString(
        quartet_values[i],
        string_buffer_capacity - string_length,
        string_buffer + string_length
        );

      if ( j <= 0 )
      {
        string_length = 0;
        break;
      }

      string_length += j;

    }
  }

  if ( string_length > string_buffer_capacity )
    string_length = 0;

  for ( i = string_length; i < string_buffer_capacity; i++ )
    string_buffer[i] = 0;

  return string_length;
}